

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::text::render_attributes(text *this,form_context *context)

{
  int iVar1;
  ostream *out;
  write_int_to_stream<int> local_20;
  write_int_to_stream<int> local_1c;
  
  base_widget::render_attributes
            ((base_widget *)
             ((long)&(this->super_base_html_input)._vptr_base_html_input +
             (long)(this->super_base_html_input)._vptr_base_html_input[-3]),context);
  out = form_context::out(context);
  if (-1 < *(int *)&(this->super_base_html_input).field_0x78) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"size=\"",6);
    local_1c.v = *(int *)&(this->super_base_html_input).field_0x78;
    impl::details::write_int_to_stream<int>::operator()(&local_1c,out);
    std::__ostream_insert<char,std::char_traits<char>>(out,"\" ",2);
  }
  iVar1 = *(int *)&(this->super_base_html_input).field_0x5c;
  if ((-1 < iVar1) && ((this->super_base_html_input).field_0x60 == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"maxlength=\"",0xb);
    local_20.v = iVar1;
    impl::details::write_int_to_stream<int>::operator()(&local_20,out);
    std::__ostream_insert<char,std::char_traits<char>>(out,"\" ",2);
  }
  if (((&(this->super_base_html_input).field_0x1f0)
       [(long)(this->super_base_html_input)._vptr_base_html_input[-3]] & 8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"readonly=\"readonly\" ",0x14);
  }
  return;
}

Assistant:

void text::render_attributes(form_context &context)
{
	base_widget::render_attributes(context);

	std::ostream &output = context.out();
	if(size_ >= 0)
		output << "size=\"" << cint(size_) <<"\" ";
	std::pair<int,int> lm=limits();
	if(lm.second >= 0 && validate_charset()) {
		output << "maxlength=\"" << cint(lm.second) << "\" ";
	}
	if(readonly()) {
		output << "readonly=\"readonly\" ";
	}
}